

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

boolean start_timer(level *lev,long when,short kind,short func_index,void *arg)

{
  timer_element *ptVar1;
  uint uVar2;
  timer_element *ptVar3;
  timer_element *ptVar4;
  timer_element *ptVar5;
  uint uVar6;
  
  if (5 < (ushort)func_index) {
    panic("start_timer");
  }
  ptVar3 = (timer_element *)calloc(1,0x20);
  uVar6 = (int)when + moves;
  uVar2 = timer_id + 1;
  ptVar3->tid = timer_id;
  timer_id = uVar2;
  ptVar3->timeout = uVar6;
  ptVar3->kind = kind;
  ptVar3->func_index = (uchar)func_index;
  ptVar3->arg = arg;
  ptVar1 = lev->lev_timers;
  ptVar5 = (timer_element *)&lev->lev_timers;
  while (ptVar4 = ptVar1, ptVar4 != (timer_element *)0x0) {
    if (uVar6 <= ptVar4->timeout) goto LAB_0025e130;
    ptVar5 = ptVar4;
    ptVar1 = ptVar4->next;
  }
  ptVar4 = (timer_element *)0x0;
LAB_0025e130:
  ptVar3->next = ptVar4;
  ptVar5->next = ptVar3;
  if (kind == 2) {
    *(char *)((long)arg + 0x49) = *(char *)((long)arg + 0x49) + '\x01';
  }
  return '\x01';
}

Assistant:

boolean start_timer(struct level *lev, long when, short kind, short func_index,void *arg)
{
    timer_element *gnu;

    if (func_index < 0 || func_index >= NUM_TIME_FUNCS)
	panic("start_timer");

    gnu = malloc(sizeof(timer_element));
    memset(gnu, 0, sizeof(timer_element));
    gnu->next = NULL;
    gnu->tid = timer_id++;
    gnu->timeout = moves + when;
    gnu->kind = kind;
    gnu->needs_fixup = FALSE;
    gnu->func_index = func_index;
    gnu->arg = arg;
    insert_timer(lev, gnu);

    if (kind == TIMER_OBJECT)	/* increment object's timed count */
	((struct obj *)arg)->timed++;

    /* should check for duplicates and fail if any */
    return TRUE;
}